

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

bool __thiscall S1Interval::Contains(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  S2LogMessage SStack_18;
  
  if (3.141592653589793 < ABS(p)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0x48,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
    abort();
  }
  dVar3 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                  -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (dVar1 <= dVar2) {
    if (dVar1 <= dVar3) {
      bVar4 = dVar3 <= dVar2;
      goto LAB_0019da12;
    }
  }
  else if ((dVar1 <= dVar3) || (dVar3 <= dVar2)) {
    bVar4 = -(dVar1 != 3.141592653589793) | -(dVar2 != -3.141592653589793);
    goto LAB_0019da12;
  }
  bVar4 = 0;
LAB_0019da12:
  return (bool)(bVar4 & 1);
}

Assistant:

bool S1Interval::Contains(double p) const {
  // Works for empty, full, and singleton intervals.
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  return FastContains(p);
}